

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

double __thiscall mjs::anon_unknown_37::date_helper::parse(date_helper *this,wstring_view s)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  long *plVar5;
  long lVar6;
  _Get_time<wchar_t> _Var7;
  wchar_t *local_2c0;
  fpos<__mbstate_t> local_250;
  undefined4 local_23c;
  wchar_t local_238;
  int local_234;
  wchar_t digits [3];
  int num_digits;
  double t;
  undefined1 local_210 [8];
  tm tm;
  allocator<wchar_t> local_1c1;
  wstring local_1c0 [32];
  long local_1a0;
  wistringstream wiss;
  undefined1 local_20 [8];
  wstring_view s_local;
  
  s_local._M_len = s._M_len;
  local_20 = (undefined1  [8])this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            (local_1c0,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_20,&local_1c1
            );
  std::__cxx11::wistringstream::basic_istringstream(&local_1a0,local_1c0,8);
  std::__cxx11::wstring::~wstring(local_1c0);
  std::allocator<wchar_t>::~allocator(&local_1c1);
  _Var7 = std::get_time<wchar_t>((tm *)local_210,L"%Y-%m-%dT%H:%M:%S");
  pbVar4 = std::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)&local_1a0,_Var7);
  bVar1 = std::wios::operator_cast_to_bool((wios *)(pbVar4 + *(long *)(*(long *)pbVar4 + -0x18)));
  if (bVar1) {
    register0x00001200 = (wchar_t *)time_from_tm((tm *)local_210);
    iVar3 = std::wistream::peek();
    if (iVar3 == 0x2e) {
      std::wistream::get();
      digits[1] = L'\x03';
      plVar5 = (long *)std::wistream::read((wchar_t *)&local_1a0,(long)&local_238);
      bVar2 = std::wios::operator!((wios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if (((bVar2 & 1) != 0) ||
         (bVar1 = std::all_of<wchar_t*,int(*)(int)noexcept>(&local_238,digits + 1,isdigit), !bVar1))
      {
        s_local._M_str = (wchar_t *)0x7ff8000000000000;
        goto LAB_001cd3b8;
      }
      register0x00001200 =
           (wchar_t *)
           ((double)((local_238 + L'\xffffffd0') * 100 + (local_234 + -0x30) * 10 +
                    digits[0] + L'\xffffffd0') + (double)stack0xfffffffffffffdd8);
    }
    iVar3 = std::wistream::peek();
    if (iVar3 == 0x5a) {
      std::wistream::get();
    }
    std::__cxx11::wistringstream::rdbuf();
    lVar6 = std::wstreambuf::in_avail();
    if (lVar6 == 0) {
      local_2c0 = stack0xfffffffffffffdd8;
    }
    else {
      local_2c0 = (wchar_t *)0x7ff8000000000000;
    }
    s_local._M_str = local_2c0;
  }
  else {
    std::fpos<__mbstate_t>::fpos(&local_250,0);
    std::wistream::seekg(&local_1a0,local_250._M_off,local_250._M_state);
    std::wios::clear((int)&local_1a0 + (int)*(undefined8 *)(local_1a0 + -0x18));
    bVar1 = std::wios::operator_cast_to_bool
                      ((wios *)((long)&local_1a0 + *(long *)(local_1a0 + -0x18)));
    if (!bVar1) {
      __assert_fail("wiss",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp"
                    ,0xb9,
                    "static double mjs::(anonymous namespace)::date_helper::parse(const std::wstring_view)"
                   );
    }
    _Var7 = std::get_time<wchar_t>((tm *)local_210,L"%a %b %d %Y %H:%M:%S");
    pbVar4 = std::operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)&local_1a0,_Var7)
    ;
    bVar1 = std::wios::operator_cast_to_bool((wios *)(pbVar4 + *(long *)(*(long *)pbVar4 + -0x18)));
    if (bVar1) {
      s_local._M_str = (wchar_t *)time_from_tm((tm *)local_210);
    }
    else {
      s_local._M_str = (wchar_t *)0x7ff8000000000000;
    }
  }
LAB_001cd3b8:
  local_23c = 1;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)&local_1a0);
  return (double)s_local._M_str;
}

Assistant:

static double parse(const std::wstring_view s) {
        std::wistringstream wiss{std::wstring{s}};
        std::tm tm;
        if (wiss >> std::get_time(&tm, iso_format)) {
            auto t = time_from_tm(tm);
            if (wiss.peek() == '.') {
                wiss.get();
                const int num_digits = 3;
                wchar_t digits[num_digits];
                if (!wiss.read(digits, num_digits) || !std::all_of(digits, digits+num_digits, isdigit)) {
                    return NAN;
                }
                t += (digits[0]-'0')*100 + (digits[1]-'0')*10 + (digits[2]-'0');
            }
            if (wiss.peek() == 'Z') {
                wiss.get();
            }
            return !wiss.rdbuf()->in_avail() ? t : NAN;
        } 
        wiss.seekg(0);
        wiss.clear();
        assert(wiss);
        if (wiss >> std::get_time(&tm, time_format)) {
            return time_from_tm(tm);
        }
        return NAN;
    }